

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_primitive_coerceASTNodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong valueExpression;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  valueExpression = arguments[1];
  if ((valueExpression & 0xf) == 0 && valueExpression != 0) {
    uVar3 = *(ulong *)(valueExpression + 0x20);
  }
  else {
    uVar3 = 0;
  }
  if (uVar3 != 0) {
    uVar2 = (context->roots).controlFlowEscapeType;
    if (((uVar2 != 0) && ((((uint)uVar2 | (uint)uVar3) & 0xf) == 0)) &&
       (uVar5 = uVar3, (*(byte *)(uVar3 + 8) & 0x80) == 0)) {
      do {
        if (uVar5 == uVar2) goto LAB_0014850a;
        puVar1 = (ulong *)(uVar5 + 0x30);
        uVar5 = *puVar1;
      } while (*puVar1 != 0);
    }
    if ((uVar3 & 0xf) == 0) {
      if ((*(byte *)(uVar3 + 8) & 0x80) != 0) goto LAB_00148535;
      uVar3 = *(ulong *)(uVar3 + 0x70);
      if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
        uVar3 = (long)uVar3 >> 4;
      }
      else {
        uVar3 = *(ulong *)(uVar3 + 0x10);
      }
    }
    else {
      uVar3 = 0;
    }
    if ((uVar3 & 0x40) != 0) {
LAB_00148535:
      sVar4 = sysbvm_astDownCastNode_addOntoNodeWithTargetType(context,valueExpression,*arguments);
      return sVar4;
    }
    sysbvm_error("Cannot perform the node type coercion.");
  }
LAB_0014850a:
  return arguments[1];
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_coerceASTNodeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *targetType = &arguments[0];
    sysbvm_tuple_t *astNode = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    (void)targetType;
    (void)environment;

    sysbvm_tuple_t sourceType = sysbvm_astNode_getAnalyzedType(*astNode);
    if(sourceType && !sysbvm_type_isDirectSubtypeOf(sourceType, context->roots.controlFlowEscapeType))
    {
        if(sysbvm_type_isDynamic(sourceType))
        {
            // Add a downcast for the untyped case.
            return sysbvm_astDownCastNode_addOntoNodeWithTargetType(context, *astNode, *targetType);
        }
        else
        {
            sysbvm_error("Cannot perform the node type coercion.");
        }
    }

    return *astNode;
}